

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_list.c
# Opt level: O2

ion_status_t sl_get(ion_skiplist_t *skiplist,ion_key_t key,ion_value_t value)

{
  ion_key_size_t iVar1;
  int iVar2;
  char cVar3;
  ion_sl_node_t *piVar4;
  ion_status_t iVar5;
  
  iVar1 = (skiplist->super).record.key_size;
  iVar2 = (skiplist->super).record.value_size;
  piVar4 = sl_find_node(skiplist,key);
  iVar5.error = '\x01';
  iVar5._1_3_ = 0;
  iVar5.count = 0;
  if (piVar4->key != (ion_key_t)0x0) {
    cVar3 = (*(skiplist->super).compare)(piVar4->key,key,iVar1);
    if (cVar3 == '\0') {
      memcpy(value,piVar4->value,(long)iVar2);
      iVar5.error = '\0';
      iVar5._1_3_ = 0;
      iVar5.count = 1;
    }
  }
  return iVar5;
}

Assistant:

ion_status_t
sl_get(
	ion_skiplist_t	*skiplist,
	ion_key_t		key,
	ion_value_t		value
) {
	ion_key_size_t		key_size	= skiplist->super.record.key_size;
	ion_value_size_t	value_size	= skiplist->super.record.value_size;
	ion_sl_node_t		*cursor		= sl_find_node(skiplist, key);

	if ((NULL == cursor->key) || (skiplist->super.compare(cursor->key, key, key_size) != 0)) {
		return ION_STATUS_ERROR(err_item_not_found);
	}

	memcpy(value, cursor->value, value_size);

	return ION_STATUS_OK(1);
}